

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CompilationUnitSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CompilationUnitSyntax,slang::syntax::CompilationUnitSyntax_const&>
          (BumpAllocator *this,CompilationUnitSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  CompilationUnitSyntax *pCVar8;
  
  pCVar8 = (CompilationUnitSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CompilationUnitSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (CompilationUnitSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pCVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pCVar8->super_SyntaxNode).parent = pSVar1;
  uVar4 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pCVar8->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pCVar8->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5388
  ;
  uVar5 = (args->endOfFile).field_0x2;
  NVar6.raw = (args->endOfFile).numFlags.raw;
  uVar7 = (args->endOfFile).rawLen;
  pIVar3 = (args->endOfFile).info;
  (pCVar8->endOfFile).kind = (args->endOfFile).kind;
  (pCVar8->endOfFile).field_0x2 = uVar5;
  (pCVar8->endOfFile).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->endOfFile).rawLen = uVar7;
  (pCVar8->endOfFile).info = pIVar3;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }